

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

Level * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
PushUnsafe<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  Level *pLVar1;
  
  pLVar1 = (Level *)this->stackTop_;
  if (pLVar1 == (Level *)0x0) {
    __assert_fail("stackTop_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/internal/stack.h"
                  ,0x82,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::Level]"
                 );
  }
  if ((long)(count * 0x10) <= (long)this->stackEnd_ - (long)pLVar1) {
    this->stackTop_ = (char *)(pLVar1 + count);
    return pLVar1;
  }
  __assert_fail("static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/internal/stack.h"
                ,0x83,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::Level]"
               );
}

Assistant:

RAPIDJSON_FORCEINLINE T* PushUnsafe(size_t count = 1) {
        RAPIDJSON_ASSERT(stackTop_);
        RAPIDJSON_ASSERT(static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_));
        T* ret = reinterpret_cast<T*>(stackTop_);
        stackTop_ += sizeof(T) * count;
        return ret;
    }